

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode_in)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  uint in_ECX;
  uint in_EDX;
  uchar *in_RSI;
  int *in_RDI;
  LodePNGColorMode *in_R8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint n;
  uchar *p;
  uint matchkey_1;
  uint bits;
  uchar a_2;
  uchar b_2;
  uchar g_2;
  uchar r_2;
  uint matchkey;
  unsigned_short a_1;
  unsigned_short b_1;
  unsigned_short g_1;
  unsigned_short r_1;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  uchar *color;
  uint maxnumcolors;
  uint sixteen;
  uint bits_done;
  uint bpp;
  uint numcolors_done;
  uint alpha_done;
  uint colored_done;
  size_t numpixels;
  ColorTree tree;
  size_t i;
  uint error;
  undefined8 in_stack_fffffffffffffec8;
  LodePNGColorMode *pLVar12;
  ColorTree *in_stack_fffffffffffffed0;
  bool local_122;
  uint local_120;
  uint in_stack_fffffffffffffee8;
  uint uVar13;
  int in_stack_fffffffffffffeec;
  int *in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  char cVar14;
  byte bVar15;
  byte bVar16;
  byte value;
  undefined4 in_stack_ffffffffffffff04;
  unsigned_short in_stack_ffffffffffffff08;
  unsigned_short uVar17;
  unsigned_short in_stack_ffffffffffffff0a;
  unsigned_short uVar18;
  unsigned_short in_stack_ffffffffffffff0c;
  unsigned_short uVar19;
  unsigned_short in_stack_ffffffffffffff0e;
  unsigned_short uVar20;
  ushort in_stack_ffffffffffffff10;
  ushort in_stack_ffffffffffffff12;
  ushort in_stack_ffffffffffffff14;
  ushort in_stack_ffffffffffffff16;
  undefined4 in_stack_ffffffffffffff20;
  ColorTree local_b8;
  ulong local_30;
  uint local_24;
  LodePNGColorMode *local_20;
  uchar *local_10;
  int *local_8;
  
  local_24 = 0;
  sVar8 = (ulong)in_EDX * (ulong)in_ECX;
  local_20 = in_R8;
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar4 = lodepng_is_greyscale_type(in_R8);
  uVar5 = lodepng_can_have_alpha((LodePNGColorMode *)in_stack_fffffffffffffed0);
  uVar6 = lodepng_get_bpp((LodePNGColorMode *)0x109114);
  uVar13 = in_stack_fffffffffffffee8 & 0xffffff;
  if (local_8[0x106] == 1) {
    uVar13 = CONCAT13(uVar6 == 1,(int3)in_stack_fffffffffffffee8);
  }
  uVar3 = uVar13 >> 0x18;
  bVar11 = false;
  local_120 = 0x101;
  if (uVar6 < 9) {
    if ((uint)(local_8[5] + (1 << ((byte)uVar6 & 0x1f))) < 0x102) {
      local_120 = local_8[5] + (1 << ((byte)uVar6 & 0x1f));
    }
    else {
      local_120 = 0x101;
    }
  }
  *(size_t *)(local_8 + 0x108) = sVar8 + *(long *)(local_8 + 0x108);
  color_tree_init(&local_b8);
  bVar2 = local_8[4] != 0 || uVar5 == 0;
  bVar1 = *local_8 != 0 || uVar4 != 0;
  bVar9 = uVar6 <= (uint)local_8[0x106] || (char)uVar3 != '\0';
  bVar10 = local_120 <= (uint)local_8[5] || local_8[0x106] == 0x10;
  if (local_120 > (uint)local_8[5] && local_8[0x106] != 0x10) {
    for (local_30 = 0; local_30 < (uint)local_8[5]; local_30 = local_30 + 1) {
      color_tree_add(in_stack_fffffffffffffed0,(uchar)((ulong)in_stack_fffffffffffffec8 >> 0x38),
                     (uchar)((ulong)in_stack_fffffffffffffec8 >> 0x30),
                     (uchar)((ulong)in_stack_fffffffffffffec8 >> 0x28),
                     (uchar)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                     (uint)in_stack_fffffffffffffec8);
    }
  }
  if (local_20->bitdepth == 0x10) {
    for (local_30 = 0; local_30 != sVar8; local_30 = local_30 + 1) {
      getPixelColorRGBA16((unsigned_short *)&stack0xffffffffffffff16,
                          (unsigned_short *)&stack0xffffffffffffff14,
                          (unsigned_short *)&stack0xffffffffffffff12,
                          (unsigned_short *)&stack0xffffffffffffff10,local_10,local_30,local_20);
      if (((((in_stack_ffffffffffffff16 & 0xff) != (int)(uint)in_stack_ffffffffffffff16 >> 8) ||
           ((in_stack_ffffffffffffff14 & 0xff) != (int)(uint)in_stack_ffffffffffffff14 >> 8)) ||
          ((in_stack_ffffffffffffff12 & 0xff) != (int)(uint)in_stack_ffffffffffffff12 >> 8)) ||
         ((in_stack_ffffffffffffff10 & 0xff) != (int)(uint)in_stack_ffffffffffffff10 >> 8)) {
        local_8[0x106] = 0x10;
        bVar11 = true;
        bVar9 = true;
        bVar10 = true;
        break;
      }
    }
  }
  if (bVar11) {
    uVar20 = 0;
    uVar19 = 0;
    uVar18 = 0;
    uVar17 = 0;
    for (local_30 = 0; local_30 != sVar8; local_30 = local_30 + 1) {
      getPixelColorRGBA16((unsigned_short *)&stack0xffffffffffffff0e,
                          (unsigned_short *)&stack0xffffffffffffff0c,
                          (unsigned_short *)&stack0xffffffffffffff0a,
                          (unsigned_short *)&stack0xffffffffffffff08,local_10,local_30,local_20);
      if ((!bVar1) && ((uVar20 != uVar19 || (uVar20 != uVar18)))) {
        *local_8 = 1;
        bVar1 = true;
      }
      if (!bVar2) {
        bVar11 = false;
        if ((uVar20 == *(unsigned_short *)(local_8 + 2)) &&
           (bVar11 = false, uVar19 == *(unsigned_short *)((long)local_8 + 10))) {
          bVar11 = uVar18 == *(unsigned_short *)(local_8 + 3);
        }
        if ((uVar17 == 0xffff) || ((uVar17 == 0 && ((local_8[1] == 0 || (bVar11)))))) {
          if ((uVar17 == 0) && ((local_8[4] == 0 && (local_8[1] == 0)))) {
            local_8[1] = 1;
            *(unsigned_short *)(local_8 + 2) = uVar20;
            *(unsigned_short *)((long)local_8 + 10) = uVar19;
            *(unsigned_short *)(local_8 + 3) = uVar18;
          }
          else if ((uVar17 == 0xffff) && ((local_8[1] != 0 && (bVar11)))) {
            local_8[4] = 1;
            local_8[1] = 0;
            bVar2 = true;
          }
        }
        else {
          local_8[4] = 1;
          local_8[1] = 0;
          bVar2 = true;
        }
      }
      if ((((bVar2) && (bVar10)) && (bVar1)) && (bVar9)) break;
    }
    if ((local_8[1] != 0) && (local_8[4] == 0)) {
      for (local_30 = 0; local_30 != sVar8; local_30 = local_30 + 1) {
        getPixelColorRGBA16((unsigned_short *)&stack0xffffffffffffff0e,
                            (unsigned_short *)&stack0xffffffffffffff0c,
                            (unsigned_short *)&stack0xffffffffffffff0a,
                            (unsigned_short *)&stack0xffffffffffffff08,local_10,local_30,local_20);
        if (((uVar17 != 0) && (uVar20 == *(unsigned_short *)(local_8 + 2))) &&
           ((uVar19 == *(unsigned_short *)((long)local_8 + 10) &&
            (uVar18 == *(unsigned_short *)(local_8 + 3))))) {
          local_8[4] = 1;
          local_8[1] = 0;
        }
      }
    }
  }
  else {
    value = 0;
    bVar16 = 0;
    bVar15 = 0;
    cVar14 = '\0';
    for (local_30 = 0; local_30 != sVar8; local_30 = local_30 + 1) {
      pLVar12 = local_20;
      getPixelColorRGBA8((uchar *)CONCAT26(in_stack_ffffffffffffff16,
                                           CONCAT24(in_stack_ffffffffffffff14,
                                                    CONCAT22(in_stack_ffffffffffffff12,
                                                             in_stack_ffffffffffffff10))),
                         (uchar *)CONCAT26(in_stack_ffffffffffffff0e,
                                           CONCAT24(in_stack_ffffffffffffff0c,
                                                    CONCAT22(in_stack_ffffffffffffff0a,
                                                             in_stack_ffffffffffffff08))),
                         (uchar *)CONCAT44(in_stack_ffffffffffffff04,
                                           CONCAT13(value,CONCAT12(bVar16,CONCAT11(bVar15,cVar14))))
                         ,(uchar *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (uchar *)in_stack_fffffffffffffef0,
                         CONCAT44(in_stack_fffffffffffffeec,uVar13),
                         (LodePNGColorMode *)CONCAT44(local_120,in_stack_ffffffffffffff20));
      if (((!bVar9) && ((uint)local_8[0x106] < 8)) &&
         (in_stack_fffffffffffffefc = getValueRequiredBits(value),
         (uint)local_8[0x106] < in_stack_fffffffffffffefc)) {
        local_8[0x106] = in_stack_fffffffffffffefc;
      }
      bVar9 = uVar6 <= (uint)local_8[0x106];
      if ((!bVar1) && ((value != bVar16 || (value != bVar15)))) {
        *local_8 = 1;
        bVar1 = true;
        if ((uint)local_8[0x106] < 8) {
          local_8[0x106] = 8;
        }
      }
      if (!bVar2) {
        local_122 = false;
        if (((ushort)value == *(ushort *)(local_8 + 2)) &&
           (local_122 = false, (ushort)bVar16 == *(ushort *)((long)local_8 + 10))) {
          local_122 = (ushort)bVar15 == *(ushort *)(local_8 + 3);
        }
        in_stack_fffffffffffffef8 = (uint)local_122;
        if ((cVar14 == -1) ||
           ((cVar14 == '\0' && ((local_8[1] == 0 || (in_stack_fffffffffffffef8 != 0)))))) {
          if ((cVar14 == '\0') && ((local_8[4] == 0 && (local_8[1] == 0)))) {
            local_8[1] = 1;
            *(ushort *)(local_8 + 2) = (ushort)value;
            *(ushort *)((long)local_8 + 10) = (ushort)bVar16;
            *(ushort *)(local_8 + 3) = (ushort)bVar15;
          }
          else if ((cVar14 == -1) && ((local_8[1] != 0 && (in_stack_fffffffffffffef8 != 0)))) {
            local_8[4] = 1;
            local_8[1] = 0;
            bVar2 = true;
            if ((uint)local_8[0x106] < 8) {
              local_8[0x106] = 8;
            }
          }
        }
        else {
          local_8[4] = 1;
          local_8[1] = 0;
          bVar2 = true;
          if ((uint)local_8[0x106] < 8) {
            local_8[0x106] = 8;
          }
        }
      }
      if ((!bVar10) &&
         (iVar7 = color_tree_has(in_stack_fffffffffffffed0,(uchar)((ulong)pLVar12 >> 0x38),
                                 (uchar)((ulong)pLVar12 >> 0x30),(uchar)((ulong)pLVar12 >> 0x28),
                                 (uchar)((ulong)pLVar12 >> 0x20)), iVar7 == 0)) {
        color_tree_add(in_stack_fffffffffffffed0,(uchar)((ulong)pLVar12 >> 0x38),
                       (uchar)((ulong)pLVar12 >> 0x30),(uchar)((ulong)pLVar12 >> 0x28),
                       (uchar)((ulong)pLVar12 >> 0x20),(uint)pLVar12);
        if ((uint)local_8[5] < 0x100) {
          in_stack_fffffffffffffef0 = local_8 + 6;
          in_stack_fffffffffffffeec = local_8[5];
          *(byte *)((long)in_stack_fffffffffffffef0 + (ulong)(uint)(in_stack_fffffffffffffeec << 2))
               = value;
          *(byte *)((long)in_stack_fffffffffffffef0 + (ulong)(in_stack_fffffffffffffeec * 4 + 1)) =
               bVar16;
          *(byte *)((long)in_stack_fffffffffffffef0 + (ulong)(in_stack_fffffffffffffeec * 4 + 2)) =
               bVar15;
          *(char *)((long)in_stack_fffffffffffffef0 + (ulong)(in_stack_fffffffffffffeec * 4 + 3)) =
               cVar14;
        }
        local_8[5] = local_8[5] + 1;
        bVar10 = local_120 <= (uint)local_8[5];
      }
      if ((((bVar2) && (bVar10)) && (bVar1)) && (bVar9)) break;
    }
    if ((local_8[1] != 0) && (local_8[4] == 0)) {
      for (local_30 = 0; local_30 != sVar8; local_30 = local_30 + 1) {
        getPixelColorRGBA8((uchar *)CONCAT26(in_stack_ffffffffffffff16,
                                             CONCAT24(in_stack_ffffffffffffff14,
                                                      CONCAT22(in_stack_ffffffffffffff12,
                                                               in_stack_ffffffffffffff10))),
                           (uchar *)CONCAT26(in_stack_ffffffffffffff0e,
                                             CONCAT24(in_stack_ffffffffffffff0c,
                                                      CONCAT22(in_stack_ffffffffffffff0a,
                                                               in_stack_ffffffffffffff08))),
                           (uchar *)CONCAT44(in_stack_ffffffffffffff04,
                                             CONCAT13(value,CONCAT12(bVar16,CONCAT11(bVar15,cVar14))
                                                     )),
                           (uchar *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (uchar *)in_stack_fffffffffffffef0,
                           CONCAT44(in_stack_fffffffffffffeec,uVar13),
                           (LodePNGColorMode *)CONCAT44(local_120,in_stack_ffffffffffffff20));
        if (((cVar14 != '\0') && ((ushort)value == *(ushort *)(local_8 + 2))) &&
           (((ushort)bVar16 == *(ushort *)((long)local_8 + 10) &&
            ((ushort)bVar15 == *(ushort *)(local_8 + 3))))) {
          local_8[4] = 1;
          local_8[1] = 0;
          if ((uint)local_8[0x106] < 8) {
            local_8[0x106] = 8;
          }
        }
      }
    }
    *(short *)(local_8 + 2) = (short)local_8[2] + (short)local_8[2] * 0x100;
    *(short *)((long)local_8 + 10) =
         *(short *)((long)local_8 + 10) + *(short *)((long)local_8 + 10) * 0x100;
    *(short *)(local_8 + 3) = (short)local_8[3] + (short)local_8[3] * 0x100;
  }
  color_tree_cleanup(in_stack_fffffffffffffed0);
  return local_24;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode_in)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = (size_t)w * (size_t)h;

  /* mark things as done already if it would be impossible to have a more expensive case */
  unsigned colored_done = lodepng_is_greyscale_type(mode_in) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode_in) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode_in);
  unsigned bits_done = (profile->bits == 1 && bpp == 1) ? 1 : 0;
  unsigned sixteen = 0; /* whether the input image is 16 bit */
  unsigned maxnumcolors = 257;
  if(bpp <= 8) maxnumcolors = LODEPNG_MIN(257, profile->numcolors + (1 << bpp));

  profile->numpixels += numpixels;

  color_tree_init(&tree);

  /*If the profile was already filled in from previous data, fill its palette in tree
  and mark things as done already if we know they are the most expensive case already*/
  if(profile->alpha) alpha_done = 1;
  if(profile->colored) colored_done = 1;
  if(profile->bits == 16) numcolors_done = 1;
  if(profile->bits >= bpp) bits_done = 1;
  if(profile->numcolors >= maxnumcolors) numcolors_done = 1;

  if(!numcolors_done)
  {
    for(i = 0; i < profile->numcolors; i++)
    {
      const unsigned char* color = &profile->palette[i * 4];
      color_tree_add(&tree, color[0], color[1], color[2], color[3], i);
    }
  }

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode_in->bitdepth == 16 && !sixteen)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        profile->bits = 16;
        sixteen = 1;
        bits_done = 1;
        numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
      }
      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
        }
      }
    }
  }
  else /* < 16-bit */
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    if(profile->key && !profile->alpha)
    {
      for(i = 0; i != numpixels; ++i)
      {
        getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
        if(a != 0 && r == profile->key_r && g == profile->key_g && b == profile->key_b)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          profile->key = 0;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}